

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void InitLeft(VP8EncIterator *it)

{
  undefined1 uVar1;
  long in_RDI;
  
  uVar1 = 0x7f;
  if (0 < *(int *)(in_RDI + 4)) {
    uVar1 = 0x81;
  }
  *(undefined1 *)(*(long *)(in_RDI + 0x178) + -1) = uVar1;
  *(undefined1 *)(*(long *)(in_RDI + 0x170) + -1) = uVar1;
  *(undefined1 *)(*(long *)(in_RDI + 0x168) + -1) = uVar1;
  memset(*(void **)(in_RDI + 0x168),0x81,0x10);
  memset(*(void **)(in_RDI + 0x170),0x81,8);
  memset(*(void **)(in_RDI + 0x178),0x81,8);
  *(undefined4 *)(in_RDI + 200) = 0;
  if (*(long *)(in_RDI + 0x160) != 0) {
    memset((void *)(in_RDI + 0x158),0,4);
  }
  return;
}

Assistant:

static void InitLeft(VP8EncIterator* const it) {
  it->y_left_[-1] = it->u_left_[-1] = it->v_left_[-1] =
      (it->y_ > 0) ? 129 : 127;
  memset(it->y_left_, 129, 16);
  memset(it->u_left_, 129, 8);
  memset(it->v_left_, 129, 8);
  it->left_nz_[8] = 0;
  if (it->top_derr_ != NULL) {
    memset(&it->left_derr_, 0, sizeof(it->left_derr_));
  }
}